

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_luma_horz
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  UWORD8 UVar2;
  int iVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  uVar1 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar1 = 0;
  }
  if (ht < 1) {
    ht = 0;
  }
  for (iVar9 = 0; iVar9 != ht; iVar9 = iVar9 + 1) {
    lVar6 = -0x300000000;
    for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
      sVar4 = 0;
      lVar5 = lVar6;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        sVar4 = sVar4 + (ushort)pu1_src[lVar5 >> 0x20] * (short)pi1_coeff[lVar8];
        lVar5 = lVar5 + 0x100000000;
      }
      iVar3 = sVar4 * 0x400 + 0x8000 >> 0x10;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      UVar2 = (UWORD8)iVar3;
      if (0xfe < iVar3) {
        UVar2 = 0xff;
      }
      pu1_dst[uVar7] = UVar2;
      lVar6 = lVar6 + 0x100000000;
    }
    pu1_src = pu1_src + src_strd;
    pu1_dst = pu1_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz(UWORD8 *pu1_src,
                                UWORD8 *pu1_dst,
                                WORD32 src_strd,
                                WORD32 dst_strd,
                                WORD8 *pi1_coeff,
                                WORD32 ht,
                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3)];

            i2_tmp = (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp = CLIP_U8(i2_tmp);

            pu1_dst[col] = (UWORD8)i2_tmp;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }

}